

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectAMultiCallThatHappensTheExpectedTimes_Test::testBody
          (TEST_MockCallTest_expectAMultiCallThatHappensTheExpectedTimes_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  long *local_68;
  MockCheckedActualCall *actualCall;
  SimpleString local_50;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_MockCallTest_expectAMultiCallThatHappensTheExpectedTimes_Test *local_10;
  TEST_MockCallTest_expectAMultiCallThatHappensTheExpectedTimes_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar2 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_40,"func");
  (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,local_40);
  SimpleString::~SimpleString(local_40);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_50,"");
  pMVar2 = mock(&local_50,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&actualCall,"func");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&actualCall);
  SimpleString::~SimpleString((SimpleString *)&actualCall);
  SimpleString::~SimpleString(&local_50);
  SimpleString::SimpleString(&local_78,"");
  pMVar2 = mock(&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"func");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_88);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  local_68 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x188))();
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_98,"");
  pMVar2 = mock(&local_98,(MockFailureReporter *)0x0);
  iVar1 = (*pMVar2->_vptr_MockSupport[0x26])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)((byte)((byte)iVar1 ^ 1) & 1),"CHECK","! mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x4a,pTVar4);
  SimpleString::~SimpleString(&local_98);
  return;
}

Assistant:

TEST(MockCallTest, expectAMultiCallThatHappensTheExpectedTimes)
{
    mock().expectNCalls(2, "func");
    mock().actualCall("func");
    MockCheckedActualCall& actualCall = (MockCheckedActualCall&) mock().actualCall("func");
    actualCall.checkExpectations();
    CHECK(! mock().expectedCallsLeft());
}